

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

void __thiscall Liby::TcpServer::start(TcpServer *this)

{
  Channel *this_00;
  undefined8 __p;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this->listenfd_ =
       ((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fd_;
  std::make_unique<Liby::Channel,Liby::Poller*&,int&>((Poller **)&local_58,(int *)&this->poller_);
  __p = local_58._M_unused._0_8_;
  local_58._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_,
             (pointer)__p);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
            ((unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&local_58);
  this_00 = (this->chan_)._M_t.
            super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>._M_t.
            super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
            super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl;
  this_00->readable_ = true;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:19:17)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:19:17)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_00->readEventCallback_,(function<void_()> *)&local_58);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:20:17)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp:20:17)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_()>::operator=(&this_00->erroEventCallback_,(function<void_()> *)&local_38);
  Channel::addChannel(this_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

void TcpServer::start() {
    listenfd_ = socket_->fd();
    chan_ = std::make_unique<Channel>(poller_, listenfd_);
    chan_->enableRead()
        .onRead([this] { handleAcceptEvent(); })
        .onErro([this] { handleErroEvent(); })
        .addChannel();
}